

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O1

void check(double d)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  byte *pbVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  runtime_error *this;
  byte *pbVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  ulong uVar16;
  uint uVar17;
  byte *pbVar18;
  byte *pbVar19;
  ulong uVar20;
  byte *pbVar21;
  bool bVar22;
  string s;
  double local_60;
  double local_58;
  byte *local_50;
  size_t local_48;
  byte local_40 [16];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,'@');
  iVar7 = snprintf((char *)local_50,local_48,"%.*e",d,0x10);
  std::__cxx11::string::resize((ulong)&local_50,(char)iVar7);
  bVar1 = *local_50;
  pbVar12 = local_50;
  if (bVar1 == 0x2d) {
    if ((byte)(local_50[1] - 0x30) < 10) {
      pbVar12 = local_50 + 1;
      goto LAB_00102619;
    }
LAB_001027b7:
    pbVar8 = (byte *)0x0;
    goto LAB_001027b9;
  }
LAB_00102619:
  if (*pbVar12 == 0x30) {
    uVar20 = 0;
    pbVar8 = (byte *)0x0;
    if ((byte)(pbVar12[1] - 0x30) < 10) goto LAB_001027b9;
    pbVar18 = pbVar12 + 1;
  }
  else {
    bVar14 = *pbVar12 - 0x30;
    if (9 < bVar14) goto LAB_001027b7;
    uVar20 = (ulong)bVar14;
    bVar14 = pbVar12[1];
    pbVar8 = pbVar12;
    while( true ) {
      pbVar18 = pbVar8 + 1;
      if (9 < (byte)(bVar14 - 0x30)) break;
      uVar20 = (ulong)(byte)(bVar14 - 0x30) + uVar20 * 10;
      bVar14 = pbVar8[2];
      pbVar8 = pbVar18;
    }
  }
  if (*pbVar18 == 0x2e) {
    if (9 < (byte)(pbVar18[1] - 0x30)) goto LAB_001027b7;
    uVar20 = (ulong)(byte)(pbVar18[1] - 0x30) + uVar20 * 10;
    pbVar8 = pbVar18 + 2;
    bVar14 = pbVar18[2];
    while ((byte)(bVar14 - 0x30) < 10) {
      uVar20 = (ulong)(byte)(bVar14 - 0x30) + uVar20 * 10;
      pbVar19 = pbVar8 + 1;
      pbVar8 = pbVar8 + 1;
      bVar14 = *pbVar19;
    }
    pbVar19 = pbVar18 + (1 - (long)pbVar8);
    pbVar18 = pbVar8;
  }
  else {
    pbVar19 = (byte *)0x0;
  }
  pbVar8 = pbVar18;
  if ((*pbVar18 | 0x20) == 0x65) {
    bVar22 = (pbVar18[1] - 0x2b & 0xfd) == 0;
    pbVar8 = pbVar18 + 1;
    if (bVar22) {
      pbVar8 = pbVar18 + 2;
    }
    bVar14 = pbVar18[(ulong)bVar22 + 1] - 0x30;
    if (bVar14 < 10) {
      bVar15 = pbVar8[1] - 0x30;
      uVar9 = (ulong)bVar15 + (ulong)bVar14 * 10;
      if (9 < bVar15) {
        uVar9 = (ulong)bVar14;
      }
      pbVar21 = pbVar8 + 2;
      if (9 < bVar15) {
        pbVar21 = pbVar8 + 1;
      }
      bVar15 = pbVar8[(ulong)(bVar15 < 10) + 1] - 0x30;
      pbVar8 = pbVar21 + (bVar15 < 10);
      uVar16 = (ulong)bVar15 + uVar9 * 10;
      if (9 < bVar15) {
        uVar16 = uVar9;
      }
      bVar15 = *pbVar8;
      while ((byte)(bVar15 - 0x30) < 10) {
        if ((long)uVar16 < 0x100000000) {
          uVar16 = (ulong)(byte)(bVar15 - 0x30) + uVar16 * 10;
        }
        pbVar21 = pbVar8 + 1;
        pbVar8 = pbVar8 + 1;
        bVar15 = *pbVar21;
      }
      uVar9 = -uVar16;
      if (pbVar18[1] != 0x2d) {
        uVar9 = uVar16;
      }
      pbVar19 = pbVar19 + uVar9;
    }
    if (9 < bVar14) goto LAB_001027b7;
  }
  iVar7 = (int)pbVar18 + ~(uint)pbVar12;
  if (0x12 < iVar7) {
    for (lVar10 = 0; (pbVar12[lVar10] == 0x30 || (pbVar12[lVar10] == 0x2e)); lVar10 = lVar10 + 1) {
    }
    if (0x12 < iVar7 - (int)lVar10) {
      pbVar8 = (byte *)fast_double_parser::parse_float_strtod((char *)local_50,&local_60);
      goto LAB_001027b9;
    }
  }
  if ((byte *)0xfffffffffffffd85 < pbVar19 + -0x135) {
    if ((uVar20 >> 0x35 == 0) && (pbVar19 + 0x16 < (byte *)0x2d)) {
      if ((long)pbVar19 < 0) {
        local_60 = (double)(long)uVar20 /
                   *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + (long)pbVar19 * -8);
      }
      else {
        local_60 = (double)(long)uVar20 *
                   *(double *)
                    (fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                     power_of_ten + (long)pbVar19 * 8);
      }
      if (bVar1 == 0x2d) {
        local_60 = -local_60;
      }
      goto LAB_001027b9;
    }
    if (uVar20 == 0) {
      if (bVar1 == 0x2d) {
        local_60 = -0.0;
      }
      else {
        local_60 = 0.0;
      }
      goto LAB_001027b9;
    }
    uVar9 = 0x3f;
    if (uVar20 != 0) {
      for (; uVar20 >> uVar9 == 0; uVar9 = uVar9 - 1) {
      }
    }
    uVar20 = uVar20 << ((byte)(uVar9 ^ 0x3f) & 0x3f);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar20;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)::
                              mantissa_64 + (long)pbVar19 * 8 + 0xa28);
    auVar2 = auVar2 * auVar4;
    if ((((~auVar2._8_4_ & 0x1ff) != 0) || (!CARRY8(auVar2._0_8_,uVar20))) ||
       (auVar3._8_8_ = 0, auVar3._0_8_ = uVar20, auVar5._8_8_ = 0,
       auVar5._0_8_ = *(ulong *)(fast_double_parser::compute_float_64(long,unsigned_long,bool,bool*)
                                 ::mantissa_128 + (long)pbVar19 * 8 + 0xa28), auVar6._8_8_ = 0,
       auVar6._0_8_ = SUB168(auVar3 * auVar5,8), auVar2 = auVar2 + auVar6,
       uVar20 <= ~SUB168(auVar3 * auVar5,0) || ((~auVar2._8_4_ & 0x1ff) != 0 || auVar2._0_8_ != -1))
       ) {
      uVar20 = auVar2._8_8_ >> (9U - (auVar2[0xf] >> 7) & 0x3f);
      uVar17 = (uint)uVar20;
      if (((auVar2 & (undefined1  [16])0x1ff) != (undefined1  [16])0x0 || auVar2._0_8_ != 0) ||
         ((uVar17 & 3) != 1)) {
        uVar20 = (uVar17 & 1) + uVar20;
        uVar16 = uVar20 >> 0x36;
        uVar9 = (((long)pbVar19 * 0x3526a >> 0x10) + 0x43f) -
                ((auVar2._8_8_ >> 0x3f ^ 1) + (uVar9 ^ 0x3f) + -1 + (ulong)(uVar16 == 0));
        if ((uVar9 != 0) && (uVar9 < 0x7ff)) {
          uVar13 = 0;
          if (uVar16 == 0) {
            uVar13 = uVar20 >> 1 & 0xefffffffffffff;
          }
          local_60 = (double)((ulong)(bVar1 == 0x2d) << 0x3f | uVar13 | uVar9 << 0x34);
          goto LAB_001027b9;
        }
      }
    }
    local_60 = 0.0;
  }
  pbVar8 = (byte *)fast_double_parser::parse_float_strtod((char *)local_50,&local_60);
LAB_001027b9:
  if (pbVar8 == (byte *)0x0) {
    printf("fast_double_parser refused to parse %s\n");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"fast_double_parser refused to parse");
  }
  else if (pbVar8 == local_50 + local_48) {
    if ((local_60 == d) && (!NAN(local_60) && !NAN(d))) {
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      return;
    }
    local_58 = local_60;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"fast_double_parser disagrees",0x1c);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    printf("fast_double_parser: %.*e\n",local_58,0x10);
    printf("reference: %.*e\n",d,0x10);
    printf("string: %s\n",local_50);
    if ((long)((ulong)local_58 ^ (ulong)d) < 0) {
      lVar10 = (long)d + (long)local_58 + 0x80000000;
    }
    else {
      lVar11 = (long)local_58 - (long)d;
      lVar10 = -lVar11;
      if (0 < lVar11) {
        lVar10 = lVar11;
      }
    }
    printf("f64_ulp_dist = %d\n",lVar10);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"fast_double_parser disagrees");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"does not point at the end");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void check(double d) {
  std::string s(64, '\0');
  auto written = std::snprintf(&s[0], s.size(), "%.*e", DBL_DIG + 1, d);
  s.resize(written);
  double x;
  const char * isok = fast_double_parser::parse_number(s.data(), &x);
  if (!isok) {
    printf("fast_double_parser refused to parse %s\n", s.c_str());
    throw std::runtime_error("fast_double_parser refused to parse");
  }
  if(isok != s.data() + s.size()) throw std::runtime_error("does not point at the end");
  if (d != x) {
    std::cerr << "fast_double_parser disagrees" << std::endl;
    printf("fast_double_parser: %.*e\n", DBL_DIG + 1, x);
    printf("reference: %.*e\n", DBL_DIG + 1, d);
    printf("string: %s\n", s.c_str());
    printf("f64_ulp_dist = %d\n", (int)f64_ulp_dist(x, d));
    throw std::runtime_error("fast_double_parser disagrees");
  }
}